

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O1

void do_weighting<sparse_parameters>
               (vw *all,uint64_t length,float *param_3,sparse_parameters *weights)

{
  weight *pwVar1;
  uint64_t uVar2;
  float fVar3;
  
  if (length != 0) {
    uVar2 = 0;
    do {
      pwVar1 = sparse_parameters::operator[](weights,uVar2 << ((byte)weights->_stride_shift & 0x3f))
      ;
      if (param_3[uVar2] <= 0.0) {
        param_3[uVar2] = 0.0;
        *pwVar1 = 0.0;
      }
      else {
        fVar3 = pwVar1[1] / param_3[uVar2];
        param_3[uVar2] = *pwVar1 * fVar3;
        *(ulong *)pwVar1 =
             CONCAT44(fVar3 * (float)((ulong)*(undefined8 *)pwVar1 >> 0x20),
                      fVar3 * (float)*(undefined8 *)pwVar1);
        if (all->normalized_updates == true) {
          pwVar1[all->normalized_idx] = fVar3 * pwVar1[all->normalized_idx];
        }
      }
      uVar2 = uVar2 + 1;
    } while (length != uVar2);
  }
  return;
}

Assistant:

void do_weighting(vw& all, uint64_t length, float* local_weights, T& weights)
{
  for (uint64_t i = 0; i < length; i++)
  {
    float* weight = &weights[i << weights.stride_shift()];
    if (local_weights[i] > 0)
    {
      float ratio = weight[1] / local_weights[i];
      local_weights[i] = weight[0] * ratio;
      weight[0] *= ratio;
      weight[1] *= ratio;  // A crude max
      if (all.normalized_updates)
        weight[all.normalized_idx] *= ratio;  // A crude max
    }
    else
    {
      local_weights[i] = 0;
      *weight = 0;
    }
  }
}